

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::endWhen
          (HumanResults *this,Stats *stats,NameStack *context,string *given,NameStack *whenStack,
          string *when)

{
  unsigned_long *puVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  string *when_local;
  NameStack *whenStack_local;
  string *given_local;
  NameStack *context_local;
  Stats *stats_local;
  HumanResults *this_local;
  
  this->whenDepth_ = this->whenDepth_ - 1;
  puVar1 = std::min<unsigned_long>(&this->whenDepth_,&this->whenWrittenDepth_);
  this->whenWrittenDepth_ = *puVar1;
  if ((this->whenDepth_ == 0) && (5 < (int)this->verbosity_)) {
    pbVar2 = Enhedron::Impl::Util::Out<std::basic_ostream<char,_std::char_traits<char>_>_>::
             operator*(&this->output_);
    ::std::operator<<(pbVar2,"\n");
  }
  if (this->whenDepth_ == 0) {
    setMaxWrittenState(this,CONTEXT);
  }
  else {
    setMaxWrittenState(this,GIVEN);
  }
  return;
}

Assistant:

virtual void endWhen(const Stats& stats,
                             const NameStack& context,
                             const string& given,
                             const NameStack& whenStack,
                             const string& when) override {
            --whenDepth_;
            whenWrittenDepth_ = min(whenDepth_, whenWrittenDepth_);

            if (whenDepth_ == 0 && verbosity_ >= Verbosity::CHECKS) {
                *output_ << "\n";
            }

            if (whenDepth_ == 0) {
                setMaxWrittenState(WrittenState::CONTEXT);
            }
            else {
                setMaxWrittenState(WrittenState::GIVEN);
            }
        }